

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void helper_4xx_tlbwe_hi_ppc64(CPUPPCState_conflict2 *env,target_ulong entry,target_ulong val)

{
  ppc6xx_tlb_t_conflict2 *ppVar1;
  long lVar2;
  long lVar3;
  CPUState *cpu;
  ulong uVar4;
  target_ulong tVar5;
  target_ulong end;
  target_ulong page;
  ppcemb_tlb_t_conflict2 *tlb;
  CPUState *cs;
  target_ulong val_local;
  target_ulong entry_local;
  CPUPPCState_conflict2 *env_local;
  
  cpu = env_cpu(env);
  uVar4 = entry & 0x3f;
  ppVar1 = (env->tlb).tlb6;
  if ((*(uint *)((long)ppVar1 + uVar4 * 0x28 + 0x20) & 8) != 0) {
    lVar2 = *(long *)((long)ppVar1 + uVar4 * 0x28 + 8);
    lVar3 = *(long *)((long)ppVar1 + uVar4 * 0x28 + 0x18);
    for (end = *(target_ulong *)((long)ppVar1 + uVar4 * 0x28 + 8); end < (ulong)(lVar2 + lVar3);
        end = end + 0x1000) {
      tlb_flush_page_ppc64(cpu,end);
    }
  }
  tVar5 = booke_tlb_to_page_size((uint)(val >> 7) & 7);
  *(target_ulong *)((long)ppVar1 + uVar4 * 0x28 + 0x18) = tVar5;
  if (((val & 0x40) != 0) && (*(ulong *)((long)ppVar1 + uVar4 * 0x28 + 0x18) < 0x1000)) {
    cpu_abort_ppc64(cpu,
                    "TLB size %lu < %u are not supported (%d)\nPlease implement TARGET_PAGE_BITS_VARY\n"
                    ,*(undefined8 *)((long)ppVar1 + uVar4 * 0x28 + 0x18),0x1000,
                    (ulong)((uint)(val >> 7) & 7));
  }
  *(target_ulong *)((long)ppVar1 + uVar4 * 0x28 + 8) =
       val & (*(long *)((long)ppVar1 + uVar4 * 0x28 + 0x18) - 1U ^ 0xffffffffffffffff);
  if ((val & 0x40) == 0) {
    *(uint *)((long)ppVar1 + uVar4 * 0x28 + 0x20) =
         *(uint *)((long)ppVar1 + uVar4 * 0x28 + 0x20) & 0xfffffff7;
  }
  else {
    *(uint *)((long)ppVar1 + uVar4 * 0x28 + 0x20) =
         *(uint *)((long)ppVar1 + uVar4 * 0x28 + 0x20) | 8;
    if ((val & 0x20) != 0) {
      cpu_abort_ppc64(cpu,"Little-endian TLB entries are not supported by now\n");
    }
  }
  *(target_ulong *)((long)ppVar1 + uVar4 * 0x28 + 0x10) = env->spr[0x3b1];
  if ((*(uint *)((long)ppVar1 + uVar4 * 0x28 + 0x20) & 8) != 0) {
    lVar2 = *(long *)((long)ppVar1 + uVar4 * 0x28 + 8);
    lVar3 = *(long *)((long)ppVar1 + uVar4 * 0x28 + 0x18);
    for (end = *(target_ulong *)((long)ppVar1 + uVar4 * 0x28 + 8); end < (ulong)(lVar2 + lVar3);
        end = end + 0x1000) {
      tlb_flush_page_ppc64(cpu,end);
    }
  }
  return;
}

Assistant:

void helper_4xx_tlbwe_hi(CPUPPCState *env, target_ulong entry,
                         target_ulong val)
{
    CPUState *cs = env_cpu(env);
    ppcemb_tlb_t *tlb;
    target_ulong page, end;

    LOG_SWTLB("%s entry %d val " TARGET_FMT_lx "\n", __func__, (int)entry,
              val);
    entry &= PPC4XX_TLB_ENTRY_MASK;
    tlb = &env->tlb.tlbe[entry];
    /* Invalidate previous TLB (if it's valid) */
    if (tlb->prot & PAGE_VALID) {
        end = tlb->EPN + tlb->size;
        LOG_SWTLB("%s: invalidate old TLB %d start " TARGET_FMT_lx " end "
                  TARGET_FMT_lx "\n", __func__, (int)entry, tlb->EPN, end);
        for (page = tlb->EPN; page < end; page += TARGET_PAGE_SIZE) {
            tlb_flush_page(cs, page);
        }
    }
    tlb->size = booke_tlb_to_page_size((val >> PPC4XX_TLBHI_SIZE_SHIFT)
                                       & PPC4XX_TLBHI_SIZE_MASK);
    /*
     * We cannot handle TLB size < TARGET_PAGE_SIZE.
     * If this ever occurs, we should implement TARGET_PAGE_BITS_VARY
     */
    if ((val & PPC4XX_TLBHI_V) && tlb->size < TARGET_PAGE_SIZE) {
        cpu_abort(cs, "TLB size " TARGET_FMT_lu " < %u "
                  "are not supported (%d)\n"
                  "Please implement TARGET_PAGE_BITS_VARY\n",
                  tlb->size, TARGET_PAGE_SIZE, (int)((val >> 7) & 0x7));
    }
    tlb->EPN = val & ~(tlb->size - 1);
    if (val & PPC4XX_TLBHI_V) {
        tlb->prot |= PAGE_VALID;
        if (val & PPC4XX_TLBHI_E) {
            /* XXX: TO BE FIXED */
            cpu_abort(cs,
                      "Little-endian TLB entries are not supported by now\n");
        }
    } else {
        tlb->prot &= ~PAGE_VALID;
    }
    tlb->PID = env->spr[SPR_40x_PID]; /* PID */
    LOG_SWTLB("%s: set up TLB %d RPN " TARGET_FMT_plx " EPN " TARGET_FMT_lx
              " size " TARGET_FMT_lx " prot %c%c%c%c PID %d\n", __func__,
              (int)entry, tlb->RPN, tlb->EPN, tlb->size,
              tlb->prot & PAGE_READ ? 'r' : '-',
              tlb->prot & PAGE_WRITE ? 'w' : '-',
              tlb->prot & PAGE_EXEC ? 'x' : '-',
              tlb->prot & PAGE_VALID ? 'v' : '-', (int)tlb->PID);
    /* Invalidate new TLB (if valid) */
    if (tlb->prot & PAGE_VALID) {
        end = tlb->EPN + tlb->size;
        LOG_SWTLB("%s: invalidate TLB %d start " TARGET_FMT_lx " end "
                  TARGET_FMT_lx "\n", __func__, (int)entry, tlb->EPN, end);
        for (page = tlb->EPN; page < end; page += TARGET_PAGE_SIZE) {
            tlb_flush_page(cs, page);
        }
    }
}